

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O1

knote * knote_index_RB_FIND(knote_index *head,knote *elm)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  knote *pkVar4;
  uint uVar5;
  long lVar6;
  
  pkVar4 = head->rbh_root;
  if (pkVar4 != (knote *)0x0) {
    uVar1 = (elm->kev).ident;
    do {
      uVar2 = (pkVar4->kev).ident;
      uVar3 = (uint)(uVar1 < uVar2);
      uVar5 = (uint)(uVar1 >= uVar2 && uVar1 != uVar2);
      if ((int)(uVar5 - uVar3) < 0) {
        lVar6 = 0x38;
      }
      else {
        lVar6 = 0x40;
        if (uVar5 == uVar3) {
          return pkVar4;
        }
      }
      pkVar4 = *(knote **)((long)&(pkVar4->kev).ident + lVar6);
    } while (pkVar4 != (knote *)0x0);
  }
  return (knote *)0x0;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}